

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QTextLayout::FormatRange>::moveAppend
          (QGenericArrayOps<QTextLayout::FormatRange> *this,FormatRange *b,FormatRange *e)

{
  qsizetype *pqVar1;
  FormatRange *pFVar2;
  
  if (b != e) {
    pFVar2 = (this->super_QArrayDataPointer<QTextLayout::FormatRange>).ptr;
    for (; b < e; b = b + 1) {
      QTextLayout::FormatRange::FormatRange
                (pFVar2 + (this->super_QArrayDataPointer<QTextLayout::FormatRange>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<QTextLayout::FormatRange>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }